

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O0

void ugui_put_event(ugui_t *gui,uint8_t event)

{
  ugui_window_t *current;
  uint8_t event_local;
  ugui_t *gui_local;
  
  if (event != '\0') {
    _ugui_window_put_event(gui->windows[gui->window_index - 1],(uint)event);
  }
  return;
}

Assistant:

void ugui_put_event(ugui_t* gui, uint8_t event)
{
	//Bypass for null events
	if(event == UGUI_EVT_NONE) {
		return;
	}
	//Pass event to active window handler
	ugui_window_t *current = gui->windows[gui->window_index - 1];
	_ugui_window_put_event(current, event);
}